

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O2

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_leave_cluster_req(raft_server *this,req_msg *req)

{
  _func_int **pp_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<cornerstone::resp_msg> sVar3;
  undefined1 auVar4 [16];
  ptr<resp_msg> pVar5;
  int local_24;
  element_type *local_20;
  
  local_20 = ((req[3].log_entries_.
               super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
             super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_24 = 0xf;
  sVar3 = std::make_shared<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int>
                    ((unsigned_long *)this,(msg_type *)&local_20,&local_24,
                     (int *)((long)&(req->super_msg_base).term_ + 4));
  _Var2 = sVar3.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (*(char *)((long)&req->last_log_idx_ + 1) == '\0') {
    *(undefined4 *)((long)&req->last_log_idx_ + 4) = 2;
    pp_Var1 = this->_vptr_raft_server;
    auVar4 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
    _Var2._M_pi = auVar4._8_8_;
    pp_Var1[4] = auVar4._0_8_;
    *(undefined1 *)(pp_Var1 + 5) = 1;
  }
  pVar5.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  pVar5.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar5.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_leave_cluster_req(req_msg& req)
{
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::leave_cluster_response, id_, req.get_src()));
    if (!config_changing_)
    {
        steps_to_down_ = 2;
        resp->accept(log_store_->next_slot());
    }

    return resp;
}